

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VWrmsNormVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,realtype *nrm)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  realtype rVar7;
  double dVar8;
  double dVar9;
  
  if (0 < nvec) {
    if (nvec == 1) {
      rVar7 = N_VWrmsNorm_Serial(*X,*W);
      *nrm = rVar7;
    }
    else {
      uVar1 = *(*X)->content;
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar6 = 0;
      }
      for (uVar5 = 0; uVar5 != (uint)nvec; uVar5 = uVar5 + 1) {
        lVar2 = *(long *)((long)X[uVar5]->content + 8);
        lVar3 = *(long *)((long)W[uVar5]->content + 8);
        nrm[uVar5] = 0.0;
        dVar8 = 0.0;
        for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
          dVar9 = *(double *)(lVar2 + uVar4 * 8) * *(double *)(lVar3 + uVar4 * 8);
          dVar8 = dVar8 + dVar9 * dVar9;
          nrm[uVar5] = dVar8;
        }
        dVar8 = dVar8 / (double)(int)uVar1;
        dVar9 = 0.0;
        if (0.0 < dVar8) {
          if (dVar8 < 0.0) {
            dVar9 = sqrt(dVar8);
          }
          else {
            dVar9 = SQRT(dVar8);
          }
        }
        nrm[uVar5] = dVar9;
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VWrmsNormVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                  realtype* nrm)
{
  int          i;
  sunindextype j, N;
  realtype*    wd=NULL;
  realtype*    xd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VWrmsNorm */
  if (nvec == 1) {
    nrm[0] = N_VWrmsNorm_Serial(X[0], W[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /* compute the WRMS norm for each vector in the vector array */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    wd = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j=0; j<N; j++) {
      nrm[i] += SUNSQR(xd[j] * wd[j]);
    }
    nrm[i] = SUNRsqrt(nrm[i]/N);
  }

  return(0);
}